

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
 __thiscall
Gudhi::Simplex_tree<Stable_options>::insert_simplex_and_subfaces<std::initializer_list<int>>
          (Simplex_tree<Stable_options> *this,initializer_list<int> *Nsimplex,
          Filtration_value *filtration)

{
  Filtration_value FVar1;
  Filtration_value FVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  Filtration_value *pFVar6;
  int *piVar7;
  undefined8 *puVar8;
  int iVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var10;
  Filtration_value *pFVar11;
  const_iterator __cbeg;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> last;
  Filtration_value *filt;
  long *in_FS_OFFSET;
  pair<boost::container::dtl::iterator_from_iiterator<boost::intrusive::tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>,_true>,_bool>
  pVar12;
  
  FVar1 = filtration[1];
  if (FVar1 == 0.0) {
    (this->nodes_label_to_list_)._M_h._M_buckets = (__buckets_ptr)0x0;
    *(undefined1 *)&(this->nodes_label_to_list_)._M_h._M_bucket_count = 1;
  }
  else {
    FVar2 = *filtration;
    if ((char)in_FS_OFFSET[-0x15] == '\0') {
      insert_simplex_and_subfaces<std::initializer_list<int>>();
    }
    lVar3 = in_FS_OFFSET[-0x18];
    if (in_FS_OFFSET[-0x17] != lVar3) {
      in_FS_OFFSET[-0x17] = lVar3;
    }
    std::vector<int,std::allocator<int>>::_M_range_insert<int_const*>
              ((vector<int,std::allocator<int>> *)(*in_FS_OFFSET + -0xc0),lVar3,FVar2,
               (long)FVar2 + (long)FVar1 * 4);
    last._M_current = (int *)in_FS_OFFSET[-0x18];
    filt = (Filtration_value *)in_FS_OFFSET[-0x17];
    if ((Filtration_value *)last._M_current != filt) {
      uVar5 = (long)filt - (long)last._M_current >> 2;
      lVar3 = 0x3f;
      if (uVar5 != 0) {
        for (; uVar5 >> lVar3 == 0; lVar3 = lVar3 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                (last._M_current,filt,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (last._M_current,filt);
      last._M_current = (int *)in_FS_OFFSET[-0x18];
      filt = (Filtration_value *)in_FS_OFFSET[-0x17];
    }
    if ((Filtration_value *)last._M_current != filt) {
      pFVar11 = (Filtration_value *)(last._M_current + 1);
      do {
        pFVar6 = pFVar11;
        if (pFVar6 == filt) goto LAB_0015f103;
        pFVar11 = (Filtration_value *)((long)pFVar6 + 4);
      } while (*(int *)((long)pFVar6 + -4) != *(int *)pFVar6);
      piVar7 = (int *)((long)pFVar6 + -4);
      iVar9 = *(int *)((long)pFVar6 + -4);
      for (; pFVar11 != filt; pFVar11 = (Filtration_value *)((long)pFVar11 + 4)) {
        iVar4 = *(int *)pFVar11;
        if (iVar9 != iVar4) {
          piVar7[1] = iVar4;
          piVar7 = piVar7 + 1;
        }
        iVar9 = iVar4;
      }
      pFVar11 = (Filtration_value *)(piVar7 + 1);
      if (pFVar11 != filt) {
        in_FS_OFFSET[-0x17] = (long)pFVar11;
        filt = pFVar11;
      }
    }
LAB_0015f103:
    if ((Filtration_value *)last._M_current != filt) {
      _Var10._M_current = last._M_current;
      do {
        if (*_Var10._M_current == (int)Nsimplex[3]._M_len) {
          puVar8 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar8 = "cannot use the dummy null_vertex() as a real vertex";
          __cxa_throw(puVar8,&char_const*::typeinfo,0);
        }
        _Var10._M_current = _Var10._M_current + 4;
      } while ((Filtration_value *)_Var10._M_current != filt);
    }
    iVar4 = (int)((ulong)((long)filt - (long)last._M_current) >> 2) + -1;
    iVar9 = (int)Nsimplex[8]._M_len;
    if (iVar4 < iVar9) {
      iVar4 = iVar9;
    }
    *(int *)&Nsimplex[8]._M_len = iVar4;
    pVar12 = rec_insert_simplex_and_subfaces_sorted<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (this,(Siblings *)Nsimplex,
                        (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                        (Nsimplex + 4),last,filt);
    filtration = pVar12._8_8_;
  }
  pVar12._8_8_ = filtration;
  pVar12.first.m_iit.members_.nodeptr_ =
       (tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
        )(tree_iterator<boost::intrusive::bhtraits<boost::container::dtl::tree_node<std::pair<const_int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Stable_options>_>_>,_void_*,_(boost::container::tree_type_enum)0,_true>,_boost::intrusive::rbtree_node_traits<void_*,_true>,_(boost::intrusive::link_mode_type)0,_boost::intrusive::dft_tag,_3U>,_false>
          )this;
  return pVar12;
}

Assistant:

std::pair<Simplex_handle, bool> insert_simplex_and_subfaces(
      const InputVertexRange& Nsimplex,
      const Filtration_value& filtration = Filtration_value())
  {
    auto first = std::begin(Nsimplex);
    auto last = std::end(Nsimplex);

    if (first == last)
      return { null_simplex(), true }; // FIXME: false would make more sense to me.

    thread_local std::vector<Vertex_handle> copy;
    copy.clear();
    copy.insert(copy.end(), first, last);
    std::sort(copy.begin(), copy.end());
    auto last_unique = std::unique(copy.begin(), copy.end());
    copy.erase(last_unique, copy.end());
    GUDHI_CHECK_code(
      for (Vertex_handle v : copy)
        GUDHI_CHECK(v != null_vertex(), "cannot use the dummy null_vertex() as a real vertex");
    )
    // Update dimension if needed. We could wait to see if the insertion succeeds, but I doubt there is much to gain.
    dimension_ = (std::max)(dimension_, static_cast<int>(std::distance(copy.begin(), copy.end())) - 1);

    return rec_insert_simplex_and_subfaces_sorted(root(), copy.begin(), copy.end(), filtration);
  }